

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffcpsr(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,char *row_status,
          int *status)

{
  LONGLONG *pLVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  void *buffer;
  FITSfile *pFVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  size_t sVar10;
  char *err_message;
  long lVar11;
  long *plVar12;
  void *local_d8;
  int nInVarCols;
  uchar *local_c8;
  int *local_c0;
  long local_b8;
  LONGLONG innaxis1;
  int nOutVarCols;
  long local_a0;
  int *local_98;
  LONGLONG hrepeat;
  size_t local_88;
  long local_80;
  long local_78;
  long *local_70;
  LONGLONG hoffset;
  LONGLONG outnaxis2;
  long local_58;
  long local_50;
  long local_48;
  LONGLONG outnaxis1;
  LONGLONG innaxis2;
  
  nInVarCols = 0;
  nOutVarCols = 0;
  hrepeat = 0;
  hoffset = 0;
  iVar4 = *status;
  if (iVar4 < 1) {
    if (infptr->HDUposition == infptr->Fptr->curhdu) {
      if (infptr->Fptr->datastart == -1) {
        ffrdef(infptr,status);
      }
    }
    else {
      ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
    }
    if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
      if (outfptr->Fptr->datastart == -1) {
        ffrdef(outfptr,status);
      }
    }
    else {
      ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
    }
    iVar4 = *status;
    if (iVar4 < 1) {
      iVar4 = infptr->Fptr->hdutype;
      if ((iVar4 == 0) || (iVar3 = outfptr->Fptr->hdutype, iVar3 == 0)) {
        ffpmsg("Can not copy rows to or from IMAGE HDUs (ffcprw)");
        *status = 0xeb;
        iVar4 = 0xeb;
      }
      else if ((iVar3 == 1 && iVar4 == 2) || (iVar3 == 2 && iVar4 == 1)) {
        ffpmsg("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
        *status = 0xe3;
        iVar4 = 0xe3;
      }
      else {
        ffgkyjj(infptr,"NAXIS1",&innaxis1,(char *)0x0,status);
        ffgkyjj(infptr,"NAXIS2",&innaxis2,(char *)0x0,status);
        ffgkyjj(outfptr,"NAXIS1",&outnaxis1,(char *)0x0,status);
        ffgkyjj(outfptr,"NAXIS2",&outnaxis2,(char *)0x0,status);
        iVar4 = *status;
        if (iVar4 < 1) {
          if (outnaxis1 == innaxis1) {
            if (innaxis2 < nrows + firstrow + -1) {
              ffpmsg("Not enough rows in input table to copy (ffcprw)");
              *status = 0x133;
              iVar4 = 0x133;
            }
            else {
              iVar4 = infptr->Fptr->tfield;
              if (iVar4 == outfptr->Fptr->tfield) {
                local_c8 = (uchar *)malloc(outnaxis1);
                if (local_c8 == (uchar *)0x0) {
                  ffpmsg("Unable to allocate memory (ffcprw)");
                  *status = 0x71;
                  iVar4 = 0x71;
                }
                else {
                  sVar10 = (long)iVar4 << 2;
                  local_c0 = (int *)malloc(sVar10);
                  local_98 = (int *)malloc(sVar10);
                  fffvcl(infptr,&nInVarCols,local_c0,status);
                  fffvcl(outfptr,&nOutVarCols,local_98,status);
                  if (nInVarCols == nOutVarCols) {
                    uVar8 = 0;
                    uVar7 = 0;
                    if (0 < nInVarCols) {
                      uVar8 = (ulong)(uint)nInVarCols;
                    }
LAB_00116f67:
                    if (uVar8 != uVar7) goto code_r0x00116f6c;
                    local_b8 = outnaxis2 + 1;
                    lVar11 = 0;
                    if (0 < nrows) {
                      lVar11 = nrows;
                    }
                    local_a0 = lVar11;
                    if (nInVarCols == 0) {
                      local_d8 = (void *)0x0;
                      nrows = 0;
                      for (lVar5 = 0; lVar11 != lVar5; lVar5 = lVar5 + 1) {
                        if ((row_status == (char *)0x0) || (row_status[lVar5] != '\0')) {
                          ffgtbb(infptr,lVar5 + firstrow,1,innaxis1,local_c8,status);
                          ffptbb(outfptr,local_b8,1,innaxis1,local_c8,status);
                          nrows = nrows + 1;
                          local_b8 = local_b8 + 1;
                          lVar11 = local_a0;
                        }
                      }
                    }
                    else {
                      if (row_status != (char *)0x0) {
                        nrows = 0;
                        for (lVar5 = 0; lVar11 != lVar5; lVar5 = lVar5 + 1) {
                          nrows = (nrows + 1) - (ulong)(row_status[lVar5] == '\0');
                        }
                      }
                      ffirow(outfptr,outnaxis2,nrows,status);
                      local_88 = 0;
                      local_d8 = (void *)0x0;
                      lVar11 = local_a0;
                      for (lVar5 = 0; lVar5 != lVar11; lVar5 = lVar5 + 1) {
                        if ((row_status == (char *)0x0) || (row_status[lVar5] != '\0')) {
                          local_58 = lVar5;
                          ffgtbb(infptr,firstrow,1,innaxis1,local_c8,status);
                          ffptbb(outfptr,local_b8,1,innaxis1,local_c8,status);
                          pFVar6 = infptr->Fptr;
                          plVar12 = &pFVar6->tableptr->twidth;
                          lVar5 = 0;
                          lVar11 = 0;
                          piVar9 = local_c0;
                          while (lVar11 < pFVar6->tfield) {
                            if (lVar5 < nInVarCols) {
                              iVar4 = piVar9[lVar5];
                              lVar11 = lVar11 + 1;
                              if (lVar11 == iVar4) {
                                local_80 = (long)iVar4;
                                local_70 = plVar12;
                                local_50 = lVar11;
                                local_48 = lVar5;
                                ffgdesll(infptr,iVar4,firstrow,&hrepeat,&hoffset,status);
                                sVar10 = hrepeat;
                                if (*(int *)(local_70 + -9) != -0x10) {
                                  if (*(int *)(local_70 + -9) == -1) {
                                    sVar10 = (hrepeat + 7) / 8;
                                  }
                                  else {
                                    sVar10 = hrepeat * *local_70;
                                  }
                                }
                                pFVar6 = outfptr->Fptr;
                                local_78 = pFVar6->heapstart + pFVar6->datastart + pFVar6->heapsize;
                                ffmbyt(infptr,infptr->Fptr->heapstart + infptr->Fptr->datastart +
                                              hoffset,0,status);
                                pFVar6 = outfptr->Fptr;
                                if (pFVar6->lasthdu == 0) {
                                  if (((long)(local_78 + sVar10) <=
                                       pFVar6->headstart[(long)pFVar6->curhdu + 1]) ||
                                     (iVar4 = ffiblk(outfptr,(long)(local_78 + sVar10 +
                                                                   ~pFVar6->headstart
                                                                    [(long)pFVar6->curhdu + 1]) /
                                                             0xb40 + 1,1,status), iVar4 < 1))
                                  goto LAB_001171e5;
                                  err_message = 
                                  "Failed to extend the size of the variable length heap (ffcprw)";
LAB_0011738c:
                                  ffpmsg(err_message);
                                  goto LAB_00117396;
                                }
LAB_001171e5:
                                if (sVar10 != 0) {
                                  buffer = local_d8;
                                  if (((long)local_88 < (long)sVar10) &&
                                     (buffer = realloc(local_d8,sVar10), local_88 = sVar10,
                                     buffer == (void *)0x0)) {
                                    *status = 0x71;
                                    err_message = 
                                    "failed to allocate memory for variable column copy (ffcprw)";
                                    goto LAB_0011738c;
                                  }
                                  ffgbyt(infptr,sVar10,buffer,status);
                                  ffmbyt(outfptr,local_78,1,status);
                                  ffpbyt(outfptr,sVar10,buffer,status);
                                  local_d8 = buffer;
                                }
                                ffpdes(outfptr,(int)local_80,local_b8,hrepeat,
                                       outfptr->Fptr->heapsize,status);
                                pLVar1 = &outfptr->Fptr->heapsize;
                                *pLVar1 = *pLVar1 + sVar10;
                                lVar5 = local_48 + 1;
                                pFVar6 = infptr->Fptr;
                                piVar9 = local_c0;
                                lVar11 = local_50;
                                plVar12 = local_70;
                              }
                            }
                            else {
                              lVar11 = lVar11 + 1;
                            }
                            plVar12 = plVar12 + 0x14;
                          }
                          local_b8 = local_b8 + 1;
                          lVar11 = local_a0;
                          lVar5 = local_58;
                        }
                        firstrow = firstrow + 1;
                      }
                    }
                    outnaxis2 = outnaxis2 + nrows;
                    ffuky(outfptr,0x51,"NAXIS2",&outnaxis2,(char *)0x0,status);
                    goto LAB_00117396;
                  }
LAB_00116f7d:
                  ffpmsg("Input and output tables have different variable columns (ffcprw)");
                  *status = 0x12e;
                  local_d8 = (void *)0x0;
LAB_00117396:
                  free(local_c8);
                  free(local_c0);
                  free(local_98);
                  free(local_d8);
                  iVar4 = *status;
                }
              }
              else {
                ffpmsg("Input and output tables do not have same number of columns (ffcprw)");
                *status = 0x12e;
                iVar4 = 0x12e;
              }
            }
          }
          else {
            ffpmsg("Input and output tables do not have same width (ffcprw)");
            *status = 0xf1;
            iVar4 = 0xf1;
          }
        }
      }
    }
  }
  return iVar4;
code_r0x00116f6c:
  piVar9 = local_c0 + uVar7;
  piVar2 = local_98 + uVar7;
  uVar7 = uVar7 + 1;
  if (*piVar9 != *piVar2) goto LAB_00116f7d;
  goto LAB_00116f67;
}

Assistant:

int ffcpsr(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
           LONGLONG nrows,      /* I - number of rows to copy  */
	   char *row_status,    /* I - quality list of rows to keep (1) or not keep (0) */
           int *status)         /* IO - error status     */
/*
  copy consecutive set of rows from infptr and append it in the outfptr table.
*/
{
    LONGLONG innaxis1, innaxis2, outnaxis1, outnaxis2, ii, jj, i0, icol;
    LONGLONG iVarCol, inPos, outPos, nVarBytes, nVarAllocBytes = 0;
    unsigned char *buffer, *varColBuff=0;
    int nInVarCols=0, nOutVarCols=0, varColDiff=0;
    int *inVarCols=0, *outVarCols=0;
    long nNewBlocks;
    LONGLONG hrepeat=0, hoffset=0;
    tcolumn *colptr=0;
    LONGLONG n_good_rows = nrows;
    
    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */

    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */

    if (*status > 0)
        return(*status);

    if ((infptr->Fptr)->hdutype == IMAGE_HDU || (outfptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy rows to or from IMAGE HDUs (ffcprw)");
       return(*status = NOT_TABLE);
    }

    if ( ((infptr->Fptr)->hdutype == BINARY_TBL &&  (outfptr->Fptr)->hdutype == ASCII_TBL) ||
         ((infptr->Fptr)->hdutype == ASCII_TBL &&  (outfptr->Fptr)->hdutype == BINARY_TBL) )
    {
       ffpmsg
       ("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
       return(*status = NOT_BTABLE);
    }

    ffgkyjj(infptr,  "NAXIS1", &innaxis1,  0, status);  /* width of input rows */
    ffgkyjj(infptr,  "NAXIS2", &innaxis2,  0, status);  /* no. of input rows */
    ffgkyjj(outfptr, "NAXIS1", &outnaxis1, 0, status);  /* width of output rows */
    ffgkyjj(outfptr, "NAXIS2", &outnaxis2, 0, status);  /* no. of output rows */

    if (*status > 0)
        return(*status);

    if (outnaxis1 != innaxis1) {
       ffpmsg
       ("Input and output tables do not have same width (ffcprw)");
       return(*status = BAD_ROW_WIDTH);
    }    

    if (firstrow + nrows - 1 > innaxis2) {
       ffpmsg
       ("Not enough rows in input table to copy (ffcprw)");
       return(*status = BAD_ROW_NUM);
    }
    
    if ((infptr->Fptr)->tfield != (outfptr->Fptr)->tfield)
    {
       ffpmsg
       ("Input and output tables do not have same number of columns (ffcprw)");
       return(*status = BAD_COL_NUM);
    }
    
    /* allocate buffer to hold 1 row of data */
    buffer = malloc( (size_t) innaxis1);
    if (!buffer) {
       ffpmsg
       ("Unable to allocate memory (ffcprw)");
       return(*status = MEMORY_ALLOCATION);
    }
 
    inVarCols = malloc(infptr->Fptr->tfield*sizeof(int));
    outVarCols = malloc(outfptr->Fptr->tfield*sizeof(int));
    fffvcl(infptr, &nInVarCols, inVarCols, status);
    fffvcl(outfptr, &nOutVarCols, outVarCols, status);
    if (nInVarCols != nOutVarCols)
       varColDiff=1;
    else
    {
       for (ii=0; ii<nInVarCols; ++ii)
       {
          if (inVarCols[ii] != outVarCols[ii])
          {
             varColDiff=1;
             break;
          }
       }
    }
    
    if (varColDiff)
    {
       ffpmsg("Input and output tables have different variable columns (ffcprw)");
       *status = BAD_COL_NUM;
       goto CLEANUP_RETURN;
    }
    
    jj = outnaxis2 + 1;
    if (nInVarCols)
    {
      if (row_status) {
	for (n_good_rows = 0, ii = 0; ii < nrows; ii++) {
	  if (row_status[ii]) n_good_rows++; 
	}
      }

       ffirow(outfptr, outnaxis2, n_good_rows, status);
       for (ii = firstrow, i0 = 0; i0 < nrows; i0++, ii++)
       {
	  /* Ignore rows with row_status[] == 0 */
	  if (row_status && !row_status[i0]) continue;

          fits_read_tblbytes (infptr, ii, 1, innaxis1, buffer, status);
          fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
          /* Now make corrections for variable length columns */
          iVarCol=0;
          colptr = (infptr->Fptr)->tableptr;
          for (icol=0; icol<(infptr->Fptr)->tfield; ++icol)
          {
             if (iVarCol < nInVarCols && inVarCols[iVarCol] == icol+1)
             {
                /* Copy from a variable length column */
                
                ffgdesll(infptr, icol+1, ii, &hrepeat, &hoffset, status);
                /* If this is a bit column, hrepeat will be number of
                   bits, not bytes. If it is a string column, hrepeat
		   is the number of bytes, twidth is the max col width 
		   and can be ignored.*/
                if (colptr->tdatatype == -TBIT)
		{
		   nVarBytes = (hrepeat+7)/8;
		}
		else if (colptr->tdatatype == -TSTRING)
		{
		   nVarBytes = hrepeat;
		}
		else
		{
		   nVarBytes = hrepeat*colptr->twidth*sizeof(char);
		}
                inPos = (infptr->Fptr)->datastart + (infptr->Fptr)->heapstart
				+ hoffset;
		outPos = (outfptr->Fptr)->datastart + (outfptr->Fptr)->heapstart
				+ (outfptr->Fptr)->heapsize;
                ffmbyt(infptr, inPos, REPORT_EOF, status);
		/* If this is not the last HDU in the file, then check if */
		/* extending the heap would overwrite the following header. */
		/* If so, then have to insert more blocks. */
                if ( !((outfptr->Fptr)->lasthdu) )
                {
		   if (outPos+nVarBytes > 
		      (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu+1])
		   {
		      nNewBlocks = (long)(((outPos+nVarBytes - 1 -
                        (outfptr->Fptr)->headstart[(outfptr->Fptr)->
                        curhdu+1]) / 2880) + 1);
                      if (ffiblk(outfptr, nNewBlocks, 1, status) > 0)
                      {
                         ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
			 goto CLEANUP_RETURN;
                      }

		   }
                }
                if (nVarBytes)
		{
		   if (nVarBytes > nVarAllocBytes)
		   {
		     /* Grow the copy buffer to accomodate the new maximum size. 
			Note it is safe to call realloc() with null input pointer, 
			which is equivalent to malloc(). */
		     unsigned char *varColBuff1 = (unsigned char *) realloc(varColBuff, nVarBytes);
		     if (! varColBuff1)
		     {
		       *status = MEMORY_ALLOCATION;
		       ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
		       goto CLEANUP_RETURN;
		     }
		     /* Record the new state */
		     varColBuff = varColBuff1;
		     nVarAllocBytes = nVarBytes;
		   }
		   /* Copy date from input to output */
                   ffgbyt(infptr, nVarBytes, varColBuff, status);
		   ffmbyt(outfptr, outPos, IGNORE_EOF, status);
                   ffpbyt(outfptr, nVarBytes, varColBuff, status);
		}
		ffpdes(outfptr, icol+1, jj, hrepeat, (outfptr->Fptr)->heapsize, status);
                (outfptr->Fptr)->heapsize += nVarBytes;
                ++iVarCol;
             }
             ++colptr;
          }
          ++jj;
       }
    }
    else
    {    
       /* copy the rows, 1 at a time */
       n_good_rows = 0;
       for (ii = firstrow, i0 = 0; i0 < nrows; i0++, ii++)
       {
	  /* Ignore rows with row_status[] == 0 */
	  if (row_status && !row_status[i0]) continue;

           fits_read_tblbytes (infptr,  ii, 1, innaxis1, buffer, status);
           fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
	   n_good_rows ++;
           jj++;
       }
    }
    outnaxis2 += n_good_rows;
    fits_update_key(outfptr, TLONGLONG, "NAXIS2", &outnaxis2, 0, status);

 CLEANUP_RETURN:
    free(buffer);
    free(inVarCols);
    free(outVarCols);
    if (varColBuff) free(varColBuff);
    return(*status);
}